

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cc
# Opt level: O0

int TVMBackendParallelLaunch(FTVMParallelLambda flambda,void *cdata,int num_task)

{
  int iVar1;
  int *piVar2;
  int local_44;
  int local_40;
  int i;
  int res;
  TVMParallelGroupEnv *penv;
  TVMParallelGroupEnv penv_;
  int num_task_local;
  void *cdata_local;
  FTVMParallelLambda flambda_local;
  
  _res = (TVMParallelGroupEnv *)&penv;
  i = 1;
  penv_._12_4_ = num_task;
  piVar2 = std::max<int>((int *)&penv_.field_0xc,&i);
  penv_.sync_handle._0_4_ = *piVar2;
  penv = (TVMParallelGroupEnv *)0x0;
  local_40 = 0;
  for (local_44 = 0; local_44 < (int)penv_.sync_handle; local_44 = local_44 + 1) {
    iVar1 = (*flambda)(local_44,_res,cdata);
    if (iVar1 != 0) {
      local_40 = -1;
    }
  }
  return local_40;
}

Assistant:

int TVMBackendParallelLaunch(
    FTVMParallelLambda flambda,
    void *cdata,
    int num_task) {

  /* [RISCV-DLR] use the master thread to run all tasks */
#ifdef DEBUG_DLR
  printf("[ParallelLaunch] num task : %d\n", num_task);
#endif
  TVMParallelGroupEnv penv_;
  TVMParallelGroupEnv *penv = &penv_;
  penv_.num_task = std::max(num_task, 1);
  penv_.sync_handle = nullptr;

  int res = 0;
#ifdef DEBUG_DLR
  printf("[ParallelLaunch] run task : ");
#endif
  for (int i = 0; i < penv_.num_task; i++) {
    if ((*flambda)(i, penv, cdata) == 0) {
      /* 0,1,2 ...*/
#ifdef DEBUG_DLR
      printf("%d\b", i);
      fflush(stdout);
#endif
    } else
      res = -1;
#ifdef DEBUG_DLR
    printf("\n");
#endif
  }
  return res;

  /*
  int res = tvm::runtime::ThreadPool::ThreadLocal()->Launch(
      flambda, cdata, num_task, 1);

    return res;
*/
}